

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsmooth.c
# Opt level: O3

FT_Error ft_smooth_render(FT_Renderer_conflict render,FT_GlyphSlot slot,FT_Render_Mode mode,
                         FT_Vector *origin)

{
  FT_UInt *pFVar1;
  FT_Memory memory;
  FT_Bool FVar2;
  uchar *puVar3;
  int iVar4;
  ulong new_count;
  long lVar5;
  long yOffset;
  FT_Error error;
  FT_Raster_Params params;
  FT_Error local_ac;
  FT_Outline *local_a8;
  FT_Bitmap *local_a0;
  FT_Memory local_98;
  FT_Raster_Params local_90;
  
  local_ac = 0;
  local_a8 = &slot->outline;
  memory = (render->root).memory;
  local_98 = memory;
  if (slot->format == render->glyph_format) {
    if ((FT_RENDER_MODE_LCD_V < mode) || (mode == FT_RENDER_MODE_MONO)) {
      local_ac = 0x13;
      goto LAB_0024bfe9;
    }
    if ((slot->internal->flags & 1) != 0) {
      ft_mem_free(memory,(slot->bitmap).buffer);
      (slot->bitmap).buffer = (uchar *)0x0;
      pFVar1 = &slot->internal->flags;
      *pFVar1 = *pFVar1 & 0xfffffffe;
    }
    FVar2 = ft_glyphslot_preset_bitmap(slot,mode,origin);
    if (FVar2 != '\0') {
      local_ac = 0x62;
      goto LAB_0024bfe9;
    }
    new_count = (ulong)(slot->bitmap).rows;
    if ((new_count == 0) || (lVar5 = (long)(slot->bitmap).pitch, lVar5 == 0)) {
      yOffset = 0;
      lVar5 = 0;
LAB_0024c174:
      slot->format = FT_GLYPH_FORMAT_BITMAP;
      goto LAB_0024c023;
    }
    yOffset = 0;
    local_a0 = &slot->bitmap;
    puVar3 = (uchar *)ft_mem_realloc(memory,lVar5,0,new_count,(void *)0x0,&local_ac);
    (slot->bitmap).buffer = puVar3;
    lVar5 = 0;
    if (local_ac == 0) {
      pFVar1 = &slot->internal->flags;
      *pFVar1 = *pFVar1 | 1;
      lVar5 = (long)(slot->bitmap_left * -0x40);
      iVar4 = (slot->bitmap).rows << 6;
      if ((slot->bitmap).pixel_mode == '\x06') {
        iVar4 = iVar4 / 3;
      }
      yOffset = (long)iVar4 + (long)(slot->bitmap_top * -0x40);
      if (origin != (FT_Vector *)0x0) {
        lVar5 = lVar5 + origin->x;
        yOffset = yOffset + origin->y;
      }
      if (lVar5 != 0 || yOffset != 0) {
        FT_Outline_Translate(local_a8,lVar5,yOffset);
      }
      if (mode < FT_RENDER_MODE_MONO) {
        if (((slot->outline).flags & 0x40) == 0) {
          local_90.target = local_a0;
          local_90.source = local_a8;
          local_90.flags = 1;
          local_ac = (*render->raster_render)(render->raster,&local_90);
        }
        else {
          local_ac = ft_smooth_raster_overlap(render,local_a8,local_a0);
        }
      }
      else if (mode == FT_RENDER_MODE_LCD) {
        local_ac = ft_smooth_raster_lcd(render,local_a8,local_a0);
      }
      else if (mode == FT_RENDER_MODE_LCD_V) {
        local_ac = ft_smooth_raster_lcdv(render,local_a8,local_a0);
      }
      if (local_ac == 0) goto LAB_0024c174;
    }
  }
  else {
    local_ac = 6;
LAB_0024bfe9:
    yOffset = 0;
    lVar5 = 0;
  }
  if ((slot->internal->flags & 1) != 0) {
    ft_mem_free(local_98,(slot->bitmap).buffer);
    (slot->bitmap).buffer = (uchar *)0x0;
    pFVar1 = &slot->internal->flags;
    *pFVar1 = *pFVar1 & 0xfffffffe;
  }
LAB_0024c023:
  if (lVar5 != 0 || yOffset != 0) {
    FT_Outline_Translate(local_a8,-lVar5,-yOffset);
  }
  return local_ac;
}

Assistant:

static FT_Error
  ft_smooth_render( FT_Renderer       render,
                    FT_GlyphSlot      slot,
                    FT_Render_Mode    mode,
                    const FT_Vector*  origin )
  {
    FT_Error     error   = FT_Err_Ok;
    FT_Outline*  outline = &slot->outline;
    FT_Bitmap*   bitmap  = &slot->bitmap;
    FT_Memory    memory  = render->root.memory;
    FT_Pos       x_shift = 0;
    FT_Pos       y_shift = 0;


    /* check glyph image format */
    if ( slot->format != render->glyph_format )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* check mode */
    if ( mode != FT_RENDER_MODE_NORMAL &&
         mode != FT_RENDER_MODE_LIGHT  &&
         mode != FT_RENDER_MODE_LCD    &&
         mode != FT_RENDER_MODE_LCD_V  )
    {
      error = FT_THROW( Cannot_Render_Glyph );
      goto Exit;
    }

    /* release old bitmap buffer */
    if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    if ( ft_glyphslot_preset_bitmap( slot, mode, origin ) )
    {
      error = FT_THROW( Raster_Overflow );
      goto Exit;
    }

    if ( !bitmap->rows || !bitmap->pitch )
      goto Exit;

    /* allocate new one */
    if ( FT_ALLOC_MULT( bitmap->buffer, bitmap->rows, bitmap->pitch ) )
      goto Exit;

    slot->internal->flags |= FT_GLYPH_OWN_BITMAP;

    x_shift = 64 * -slot->bitmap_left;
    y_shift = 64 * -slot->bitmap_top;
    if ( bitmap->pixel_mode == FT_PIXEL_MODE_LCD_V )
      y_shift += 64 * (FT_Int)bitmap->rows / 3;
    else
      y_shift += 64 * (FT_Int)bitmap->rows;

    if ( origin )
    {
      x_shift += origin->x;
      y_shift += origin->y;
    }

    /* translate outline to render it into the bitmap */
    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, x_shift, y_shift );

    if ( mode == FT_RENDER_MODE_NORMAL ||
         mode == FT_RENDER_MODE_LIGHT  )
    {
      if ( outline->flags & FT_OUTLINE_OVERLAP )
        error = ft_smooth_raster_overlap( render, outline, bitmap );
      else
      {
        FT_Raster_Params  params;


        params.target = bitmap;
        params.source = outline;
        params.flags  = FT_RASTER_FLAG_AA;

        error = render->raster_render( render->raster, &params );
      }
    }
    else
    {
      if ( mode == FT_RENDER_MODE_LCD )
        error = ft_smooth_raster_lcd ( render, outline, bitmap );
      else if ( mode == FT_RENDER_MODE_LCD_V )
        error = ft_smooth_raster_lcdv( render, outline, bitmap );

#ifdef FT_CONFIG_OPTION_SUBPIXEL_RENDERING

      /* finally apply filtering */
      {
        FT_Byte*                 lcd_weights;
        FT_Bitmap_LcdFilterFunc  lcd_filter_func;


        /* Per-face LCD filtering takes priority if set up. */
        if ( slot->face && slot->face->internal->lcd_filter_func )
        {
          lcd_weights     = slot->face->internal->lcd_weights;
          lcd_filter_func = slot->face->internal->lcd_filter_func;
        }
        else
        {
          lcd_weights     = slot->library->lcd_weights;
          lcd_filter_func = slot->library->lcd_filter_func;
        }

        if ( lcd_filter_func )
          lcd_filter_func( bitmap, lcd_weights );
      }

#endif /* FT_CONFIG_OPTION_SUBPIXEL_RENDERING */

    }

  Exit:
    if ( !error )
    {
      /* everything is fine; the glyph is now officially a bitmap */
      slot->format = FT_GLYPH_FORMAT_BITMAP;
    }
    else if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, -x_shift, -y_shift );

    return error;
  }